

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O1

LY_ERR ly_path_dup_predicates(ly_ctx *ctx,ly_path_predicate *pred,ly_path_predicate **dup)

{
  int iVar1;
  ly_path_predicate *plVar2;
  long *plVar3;
  char *pcVar4;
  ulong uVar5;
  undefined8 *puVar6;
  long lVar7;
  
  if (pred != (ly_path_predicate *)0x0) {
    plVar2 = *dup;
    if (plVar2 == (ly_path_predicate *)0x0) {
      plVar3 = (long *)calloc(1,*(long *)((long)&pred[-1].field_1 + 0x28) * 0x38 + 8);
    }
    else {
      plVar3 = (long *)realloc((void *)((long)&plVar2[-1].field_1 + 0x28),
                               (*(long *)((long)&pred[-1].field_1 + 0x28) +
                               *(long *)((long)&plVar2[-1].field_1 + 0x28)) * 0x38 + 8);
    }
    if (plVar3 == (long *)0x0) {
      ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_path_dup_predicates");
      return LY_EMEM;
    }
    *dup = (ly_path_predicate *)(plVar3 + 1);
    lVar7 = *(long *)((long)&pred[-1].field_1 + 0x28);
    memset(plVar3 + *plVar3 * 7 + 1,0,lVar7 * 0x38);
    if (lVar7 == 0) {
      return LY_SUCCESS;
    }
    puVar6 = (undefined8 *)((long)&pred->field_1 + 8);
    lVar7 = 0x10;
    uVar5 = 0;
    do {
      plVar2 = *dup;
      plVar3 = (long *)((long)&plVar2[-1].field_1 + 0x28);
      *plVar3 = *plVar3 + 1;
      *(ly_path_pred_type *)((long)plVar2 + lVar7 + -0x10) = pred->type;
      iVar1 = *(int *)(puVar6 + -2);
      if (iVar1 - 1U < 2) {
        *(undefined8 *)((long)plVar2 + lVar7 + -8) = puVar6[-1];
        (**(code **)(*(long *)(puVar6[1] + 0x10) + 0x30))(ctx,puVar6,(long)&(*dup)->type + lVar7);
        LOCK();
        *(int *)(puVar6[1] + 0x1c) = *(int *)(puVar6[1] + 0x1c) + 1;
        UNLOCK();
      }
      else if (iVar1 == 3) {
        *(undefined8 *)((long)plVar2 + lVar7 + -8) = puVar6[-1];
        pcVar4 = strdup((char *)*puVar6);
        *(char **)((long)&(*dup)->type + lVar7) = pcVar4;
      }
      else if (iVar1 == 0) {
        *(undefined8 *)((long)plVar2 + lVar7 + -8) = puVar6[-1];
      }
      uVar5 = uVar5 + 1;
      puVar6 = puVar6 + 7;
      lVar7 = lVar7 + 0x38;
    } while (uVar5 < *(ulong *)((long)&pred[-1].field_1 + 0x28));
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
ly_path_dup_predicates(const struct ly_ctx *ctx, const struct ly_path_predicate *pred, struct ly_path_predicate **dup)
{
    LY_ARRAY_COUNT_TYPE u;

    if (!pred) {
        return LY_SUCCESS;
    }

    LY_ARRAY_CREATE_RET(ctx, *dup, LY_ARRAY_COUNT(pred), LY_EMEM);
    LY_ARRAY_FOR(pred, u) {
        LY_ARRAY_INCREMENT(*dup);
        (*dup)[u].type = pred->type;

        switch (pred[u].type) {
        case LY_PATH_PREDTYPE_POSITION:
            /* position-predicate */
            (*dup)[u].position = pred[u].position;
            break;
        case LY_PATH_PREDTYPE_LIST:
        case LY_PATH_PREDTYPE_LEAFLIST:
            /* key-predicate or leaf-list-predicate */
            (*dup)[u].key = pred[u].key;
            pred[u].value.realtype->plugin->duplicate(ctx, &pred[u].value, &(*dup)[u].value);
            LY_ATOMIC_INC_BARRIER(((struct lysc_type *)pred[u].value.realtype)->refcount);
            break;
        case LY_PATH_PREDTYPE_LIST_VAR:
            /* key-predicate with a variable */
            (*dup)[u].key = pred[u].key;
            (*dup)[u].variable = strdup(pred[u].variable);
            break;
        }
    }

    return LY_SUCCESS;
}